

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O3

void __thiscall
Js::JavascriptWeakMap::MarkVisitKindSpecificPtrs
          (JavascriptWeakMap *this,SnapshotExtractor *extractor)

{
  int iVar1;
  RecyclableObject *pRVar2;
  bool bVar3;
  uint uVar4;
  SnapshotExtractor *pSVar5;
  SnapshotExtractor *pSVar6;
  int iVar7;
  int iVar8;
  Var local_70;
  SnapshotExtractor *local_68;
  ScriptContext *local_60;
  RecyclableObject *local_58;
  RecyclableObject *local_50;
  SnapshotExtractor *local_48;
  ulong local_40;
  RecyclableObject *local_38;
  Var value;
  
  local_60 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  pSVar6 = (SnapshotExtractor *)this;
  local_68 = extractor;
  if (local_60->TTDReplayModeEnabled == false) {
    uVar4 = (this->keySet).
            super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            .bucketCount;
  }
  else {
    uVar4 = (this->keySet).
            super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            .bucketCount;
    if (uVar4 == 0) {
      return;
    }
    local_48 = (SnapshotExtractor *)&this->keySet;
    local_50 = (RecyclableObject *)((ulong)this | 1);
    local_40 = 0;
    do {
      iVar8 = (this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .buckets.ptr[local_40];
      if (iVar8 != -1) {
        iVar7 = -1;
        do {
          pRVar2 = (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .weakRefs.ptr[iVar8].ptr;
          if (pRVar2 == (RecyclableObject *)0x0) {
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar8].super_ValueEntryData<bool>.next;
            pSVar6 = local_48;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                        *)local_48,iVar8,iVar7,(uint)local_40);
          }
          else {
            pSVar5 = (SnapshotExtractor *)
                     GetWeakMapKeyMapFromKey((JavascriptWeakMap *)pSVar6,pRVar2);
            if (pSVar5 != (SnapshotExtractor *)0x0) {
              local_38 = local_50;
              pSVar6 = pSVar5;
              bVar3 = JsUtil::
                      BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                     *)pSVar5,&local_38);
              if (bVar3) {
                KeyMapGet(this,(WeakMapKeyMap *)pSVar5,&local_70);
                local_58 = pRVar2;
                pSVar6 = (SnapshotExtractor *)
                         Memory::
                         RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         ::operator->(&local_60->TTDContextInfo->TTDWeakReferencePinSet);
                local_38 = pRVar2;
                JsUtil::
                BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                          ((BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                            *)pSVar6,&local_38,&local_58);
              }
            }
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar8].super_ValueEntryData<bool>.next;
            iVar7 = iVar8;
          }
          iVar8 = iVar1;
        } while (iVar8 != -1);
        uVar4 = (this->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                .bucketCount;
      }
      local_40 = local_40 + 1;
    } while (local_40 < uVar4);
  }
  if (uVar4 != 0) {
    local_48 = (SnapshotExtractor *)&this->keySet;
    local_50 = (RecyclableObject *)((ulong)this | 1);
    local_40 = 0;
    do {
      iVar8 = (this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .buckets.ptr[local_40];
      if (iVar8 != -1) {
        iVar7 = -1;
        do {
          pRVar2 = (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .weakRefs.ptr[iVar8].ptr;
          if (pRVar2 == (RecyclableObject *)0x0) {
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar8].super_ValueEntryData<bool>.next;
            pSVar6 = local_48;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                        *)local_48,iVar8,iVar7,(uint)local_40);
          }
          else {
            local_38 = (RecyclableObject *)0x0;
            pSVar5 = (SnapshotExtractor *)
                     GetWeakMapKeyMapFromKey((JavascriptWeakMap *)pSVar6,pRVar2);
            if (pSVar5 != (SnapshotExtractor *)0x0) {
              local_58 = local_50;
              pSVar6 = pSVar5;
              bVar3 = JsUtil::
                      BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                     *)pSVar5,&local_58);
              if (bVar3) {
                KeyMapGet(this,(WeakMapKeyMap *)pSVar5,&local_38);
                pSVar6 = local_68;
                TTD::SnapshotExtractor::MarkVisitVar(local_68,local_38);
              }
            }
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar8].super_ValueEntryData<bool>.next;
            iVar7 = iVar8;
          }
          iVar8 = iVar1;
        } while (iVar8 != -1);
        uVar4 = (this->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                .bucketCount;
      }
      local_40 = local_40 + 1;
    } while (local_40 < uVar4);
  }
  return;
}

Assistant:

void JavascriptWeakMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        //All weak things should be reachable from another root so no need to mark but do need to repopulate the pin sets if in replay mode
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        if(scriptContext->IsTTDReplayModeEnabled())
        {
            this->Map([&](RecyclableObject* key, Js::Var value)
            {
                scriptContext->TTDContextInfo->TTDWeakReferencePinSet->AddNew(key);
            });
        }

        //Keys are weak so are always reachable from somewhere else but values are not so we must walk them
        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            extractor->MarkVisitVar(value);
        });
    }